

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  undefined1 uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long __tmp;
  
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar8 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar8 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  uVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar10 = uVar4;
  if ((uVar4 & 1) != 0) {
    uVar10 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
  }
  if (uVar8 == uVar10) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar4;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar2;
    pvVar5 = (other->field_0)._impl_.name_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.extendee_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.extendee_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.name_.tagged_ptr_.ptr_ = (this->field_0)._impl_.name_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.extendee_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.name_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.extendee_.tagged_ptr_.ptr_ = pvVar6;
    pvVar5 = (other->field_0)._impl_.type_name_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.default_value_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.default_value_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.type_name_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.type_name_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.default_value_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.type_name_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.default_value_.tagged_ptr_.ptr_ = pvVar6;
    pvVar5 = (other->field_0)._impl_.json_name_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.json_name_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.json_name_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.json_name_.tagged_ptr_.ptr_ = pvVar5;
    lVar9 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&this->field_0 + lVar9 + 0x30);
      *(undefined1 *)((long)&this->field_0 + lVar9 + 0x30) =
           *(undefined1 *)((long)&other->field_0 + lVar9 + 0x30);
      *(undefined1 *)((long)&other->field_0 + lVar9 + 0x30) = uVar1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x1c);
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }